

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QString * __thiscall QAuthenticator::password(QString *__return_storage_ptr__,QAuthenticator *this)

{
  if (this->d == (QAuthenticatorPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(this->d->password).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAuthenticator::password() const
{
    return d ? d->password : QString();
}